

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeFreeCursorNN(Vdbe *p,VdbeCursor *pCx)

{
  u8 uVar1;
  BtCursor *pBVar2;
  long lVar3;
  BtCursor *in_RSI;
  sqlite3_module *pModule;
  sqlite3_vtab_cursor *pVCur;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  sqlite3 *in_stack_ffffffffffffffe0;
  
  if ((*(byte *)((long)&in_RSI->skipNext + 1) >> 4 & 1) == 0) {
    uVar1 = in_RSI->eState;
    if (uVar1 == '\0') {
      sqlite3BtreeCloseCursor(in_RSI);
    }
    else if (uVar1 == '\x01') {
      sqlite3VdbeSorterClose
                (in_stack_ffffffffffffffe0,
                 (VdbeCursor *)(ulong)CONCAT14(1,in_stack_ffffffffffffffd8));
    }
    else if (uVar1 == '\x02') {
      pBVar2 = in_RSI->pNext;
      lVar3 = **(long **)pBVar2;
      *(int *)(*(long *)pBVar2 + 8) = *(int *)(*(long *)pBVar2 + 8) + -1;
      (**(code **)(lVar3 + 0x38))(pBVar2);
    }
  }
  else {
    freeCursorWithCache((Vdbe *)in_stack_ffffffffffffffe0,
                        (VdbeCursor *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8))
    ;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeFreeCursorNN(Vdbe *p, VdbeCursor *pCx){
  if( pCx->colCache ){
    freeCursorWithCache(p, pCx);
    return;
  }
  switch( pCx->eCurType ){
    case CURTYPE_SORTER: {
      sqlite3VdbeSorterClose(p->db, pCx);
      break;
    }
    case CURTYPE_BTREE: {
      assert( pCx->uc.pCursor!=0 );
      sqlite3BtreeCloseCursor(pCx->uc.pCursor);
      break;
    }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    case CURTYPE_VTAB: {
      sqlite3_vtab_cursor *pVCur = pCx->uc.pVCur;
      const sqlite3_module *pModule = pVCur->pVtab->pModule;
      assert( pVCur->pVtab->nRef>0 );
      pVCur->pVtab->nRef--;
      pModule->xClose(pVCur);
      break;
    }
#endif
  }
}